

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.hpp
# Opt level: O2

void __thiscall
Qentem::
HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
::Sort(HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
       *this,bool ascend)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,ascend) == 0) {
    Memory::
    Sort<false,Qentem::HAItem_T<Qentem::String<wchar_t>,Qentem::Value<wchar_t>>,unsigned_int>
              ((HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)
               (this->hashTable_ + this->capacity_),0,this->index_);
  }
  else {
    Memory::Sort<true,Qentem::HAItem_T<Qentem::String<wchar_t>,Qentem::Value<wchar_t>>,unsigned_int>
              ((HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)
               (this->hashTable_ + this->capacity_),0,this->index_);
  }
  Memory::SetToZero<unsigned_int>(this->hashTable_,this->capacity_ << 2);
  generateHash(this);
  return;
}

Assistant:

void Sort(const bool ascend = true) noexcept {
        constexpr SizeT32 size = sizeof(SizeT);

        if (ascend) {
            Memory::Sort<true>(Storage(), SizeT{0}, Size());
        } else {
            Memory::Sort<false>(Storage(), SizeT{0}, Size());
        }

        Memory::SetToZero(getHashTable(), (size * Capacity()));
        generateHash();
    }